

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
FlowGraph::InsertInlineeOnFLowEdge
          (FlowGraph *this,BranchInstr *instrBr,Instr *inlineeEndInstr,Instr *instrBytecode,
          Func *origBrFunc,uint32 origByteCodeOffset,bool origBranchSrcOpndIsJITOpt,
          uint32 origBranchSrcSymId)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  BranchInstr *this_00;
  LabelInstr *this_01;
  Instr *this_02;
  Opnd *pOVar8;
  ByteCodeUsesInstr *this_03;
  JITTimeFunctionBody *pJVar9;
  
  if ((instrBr->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  IR::BranchInstr::Invert(instrBr);
  if ((instrBr->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  this_00 = IR::BranchInstr::New(Br,instrBr->m_branchTarget,origBrFunc);
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,origByteCodeOffset);
  IR::Instr::InsertAfter(&instrBr->super_Instr,&this_00->super_Instr);
  this_01 = IR::LabelInstr::New(Label,(instrBr->super_Instr).m_func,false);
  IR::Instr::SetByteCodeOffset(&this_01->super_Instr,instrBytecode);
  IR::Instr::InsertAfter(&this_00->super_Instr,&this_01->super_Instr);
  if ((instrBr->super_Instr).m_kind != InstrKindBranch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  if (instrBr->m_isMultiBranch == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  if (instrBr->m_branchTarget != (LabelInstr *)0x0) {
    IR::LabelInstr::RemoveLabelRef(instrBr->m_branchTarget,instrBr);
  }
  IR::LabelInstr::AddLabelRef(this_01,instrBr);
  instrBr->m_branchTarget = this_01;
  this_02 = IR::Instr::New(InlineeEnd,inlineeEndInstr->m_func);
  pOVar8 = inlineeEndInstr->m_src1;
  if (this_02->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  pFVar1 = this_02->m_func;
  if (pOVar8->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  bVar4 = pOVar8->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar8 = IR::Opnd::Copy(pOVar8,pFVar1);
    bVar4 = pOVar8->field_0xb;
  }
  pOVar8->field_0xb = bVar4 | 2;
  this_02->m_src1 = pOVar8;
  pOVar8 = inlineeEndInstr->m_src2;
  if (this_02->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  pFVar1 = this_02->m_func;
  if (pOVar8->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  bVar4 = pOVar8->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar8 = IR::Opnd::Copy(pOVar8,pFVar1);
    bVar4 = pOVar8->field_0xb;
  }
  pOVar8->field_0xb = bVar4 | 2;
  this_02->m_src2 = pOVar8;
  IR::Instr::SetByteCodeOffset(this_02,instrBytecode);
  this_02->field_0x38 = this_02->field_0x38 | 8;
  IR::Instr::InsertBefore(&this_00->super_Instr,this_02);
  this_03 = IR::ByteCodeUsesInstr::New(origBrFunc,origByteCodeOffset);
  IR::ByteCodeUsesInstr::SetRemovedOpndSymbol(this_03,origBranchSrcOpndIsJITOpt,origBranchSrcSymId);
  IR::Instr::InsertBefore(&this_00->super_Instr,&this_03->super_Instr);
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(((this_00->super_Instr).m_func)->m_workItem);
  uVar5 = JITTimeFunctionBody::GetFunctionNumber(pJVar9);
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(origBrFunc->m_workItem);
  uVar6 = JITTimeFunctionBody::GetFunctionNumber(pJVar9);
  if (uVar5 != uVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xc2a,"(newBrFnNumber == origBrFunc->GetFunctionNumber())",
                       "newBrFnNumber == origBrFunc->GetFunctionNumber()");
    if (!bVar3) goto LAB_0041f4ef;
    *puVar7 = 0;
  }
  pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inlineeEndInstr->m_func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetFunctionNumber(pJVar9);
  if (uVar5 == uVar6) {
    pJVar9 = JITTimeWorkItem::GetJITFunctionBody(inlineeEndInstr->m_func->parentFunc->m_workItem);
    uVar6 = JITTimeFunctionBody::GetFunctionNumber(pJVar9);
    if (uVar5 != uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc2f,
                         "(newBrFnNumber != inlineeEndInstr->m_func->GetFunctionNumber() || newBrFnNumber == inlineeEndInstr->m_func->GetParentFunc()->GetFunctionNumber())"
                         ,
                         "newBrFnNumber != inlineeEndInstr->m_func->GetFunctionNumber() || newBrFnNumber == inlineeEndInstr->m_func->GetParentFunc()->GetFunctionNumber()"
                        );
      if (!bVar3) {
LAB_0041f4ef:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  return;
}

Assistant:

void
FlowGraph::InsertInlineeOnFLowEdge(IR::BranchInstr *instrBr, IR::Instr *inlineeEndInstr, IR::Instr *instrBytecode, Func* origBrFunc, uint32 origByteCodeOffset, bool origBranchSrcOpndIsJITOpt, uint32 origBranchSrcSymId)
{
    // Helper for PeepsCm code.
    //
    // We've skipped some InlineeEnd.  Globopt expects to see these
    // on all flow paths out of the inlinee.  Insert an InlineeEnd
    // on the new path:
    //      BrEq $L1, a, b
    // Becomes:
    //      BrNeq $L2, a, b
    //      InlineeEnd
    //      Br $L1
    //  L2:

    instrBr->AsBranchInstr()->Invert();

    IR::BranchInstr *newBr = IR::BranchInstr::New(Js::OpCode::Br, instrBr->AsBranchInstr()->GetTarget(), origBrFunc);
    newBr->SetByteCodeOffset(origByteCodeOffset);
    instrBr->InsertAfter(newBr);

    IR::LabelInstr *newLabel = IR::LabelInstr::New(Js::OpCode::Label, instrBr->m_func);
    newLabel->SetByteCodeOffset(instrBytecode);
    newBr->InsertAfter(newLabel);
    instrBr->AsBranchInstr()->SetTarget(newLabel);

    IR::Instr *newInlineeEnd = IR::Instr::New(Js::OpCode::InlineeEnd, inlineeEndInstr->m_func);
    newInlineeEnd->SetSrc1(inlineeEndInstr->GetSrc1());
    newInlineeEnd->SetSrc2(inlineeEndInstr->GetSrc2());
    newInlineeEnd->SetByteCodeOffset(instrBytecode);
    newInlineeEnd->SetIsCloned(true);  // Mark it as cloned - this is used later by the inlinee args optimization
    newBr->InsertBefore(newInlineeEnd);

    IR::ByteCodeUsesInstr * useOrigBranchSrcInstr = IR::ByteCodeUsesInstr::New(origBrFunc, origByteCodeOffset);
    useOrigBranchSrcInstr->SetRemovedOpndSymbol(origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    newBr->InsertBefore(useOrigBranchSrcInstr);

    uint newBrFnNumber = newBr->m_func->GetFunctionNumber();
    Assert(newBrFnNumber == origBrFunc->GetFunctionNumber());

    // The function numbers of the new branch and the inlineeEnd instruction should be different (ensuring that the new branch is not added in the inlinee but in the inliner).
    // Only case when they can be same is recursive calls - inlinee and inliner are the same function
    Assert(newBrFnNumber != inlineeEndInstr->m_func->GetFunctionNumber() ||
        newBrFnNumber == inlineeEndInstr->m_func->GetParentFunc()->GetFunctionNumber());
}